

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_cs_example.cc
# Opt level: O1

void GEN_CS::gen_cs_example_mtr(cb_to_cs_adf *c,multi_ex *ec_seq,label *cs_labels)

{
  pointer *pppeVar1;
  wclass *pwVar2;
  iterator __position;
  bool bVar3;
  pointer ppeVar4;
  example **__args;
  long lVar5;
  ulong uVar6;
  wclass wc;
  wclass local_48;
  vector<example*,std::allocator<example*>> *local_38;
  
  bVar3 = CB::ec_is_example_header
                    (*(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                      super__Vector_impl_data._M_start);
  ppeVar4 = (c->mtr_ec_seq).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  c->action_sum =
       (c->action_sum - (ulong)bVar3) +
       ((long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3);
  c->event_sum = c->event_sum + 1;
  if ((c->mtr_ec_seq).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppeVar4) {
    (c->mtr_ec_seq).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppeVar4;
  }
  v_array<COST_SENSITIVE::wclass>::clear(&cs_labels->costs);
  ppeVar4 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppeVar4) {
    local_38 = (vector<example*,std::allocator<example*>> *)&c->mtr_ec_seq;
    lVar5 = 0;
    uVar6 = 0;
    do {
      pwVar2 = (ppeVar4[uVar6]->l).cs.costs._begin;
      local_48.partial_prediction = 0.0;
      local_48.wap_value = 0.0;
      if (uVar6 == 0 && bVar3) {
        local_48.x = -3.4028235e+38;
        local_48.class_index = 0;
LAB_0026be19:
        __args = (example **)
                 ((long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                        super__Vector_impl_data._M_start + lVar5);
        __position._M_current =
             (c->mtr_ec_seq).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (c->mtr_ec_seq).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<example*,std::allocator<example*>>::_M_realloc_insert<example*const&>
                    (local_38,__position,__args);
        }
        else {
          *__position._M_current = *__args;
          pppeVar1 = &(c->mtr_ec_seq).super__Vector_base<example_*,_std::allocator<example_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppeVar1 = *pppeVar1 + 1;
        }
        v_array<COST_SENSITIVE::wclass>::push_back(&cs_labels->costs,&local_48);
      }
      else if ((long)(ppeVar4[uVar6]->l).cs.costs._end - (long)pwVar2 == 0x10) {
        local_48.x = pwVar2->x;
        if ((local_48.x != 3.4028235e+38) || (NAN(local_48.x))) {
          local_48.class_index = 0;
          c->mtr_example = (uint32_t)uVar6;
          goto LAB_0026be19;
        }
      }
      uVar6 = uVar6 + 1;
      ppeVar4 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 8;
    } while (uVar6 < (ulong)((long)(ec_seq->
                                   super__Vector_base<example_*,_std::allocator<example_*>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)ppeVar4 >> 3));
  }
  return;
}

Assistant:

void gen_cs_example_mtr(cb_to_cs_adf& c, multi_ex& ec_seq, COST_SENSITIVE::label& cs_labels)
{
  bool shared = CB::ec_is_example_header(*(ec_seq[0]));
  c.action_sum += ec_seq.size();
  if (shared)
    c.action_sum -= 1;
  c.event_sum++;

  c.mtr_ec_seq.clear();
  cs_labels.costs.clear();
  for (size_t i = 0; i < ec_seq.size(); i++)
  {
    CB::label ld = ec_seq[i]->l.cb;

    COST_SENSITIVE::wclass wc = {0, 0, 0, 0};

    bool keep_example = false;
    if (shared && i == 0)
    {
      wc.x = -FLT_MAX;
      keep_example = true;
    }
    else if (ld.costs.size() == 1 && ld.costs[0].cost != FLT_MAX)
    {
      wc.x = ld.costs[0].cost;
      c.mtr_example = (uint32_t)i;
      keep_example = true;
    }
    if (keep_example)
    {
      c.mtr_ec_seq.push_back(ec_seq[i]);
      cs_labels.costs.push_back(wc);
    }
  }
}